

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QList<QString>>::emplace<QList<QString>const&>
          (QHash<QString,_QList<QString>_> *this,QString *key,QList<QString> *args)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QString,_QList<QString>_> copy;
  QList<QString> *in_stack_ffffffffffffff48;
  QList<QString> *in_stack_ffffffffffffff50;
  QList<QString> *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  QHash<QString,_QList<QString>_> *in_stack_ffffffffffffff68;
  undefined1 local_38 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QString,_QList<QString>_>::isDetached
                    ((QHash<QString,_QList<QString>_> *)in_stack_ffffffffffffff50);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::shouldGrow
                      ((Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)*in_RDI);
    if (bVar2) {
      QList<QString>::QList(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_38 = (undefined1  [16])
                 emplace_helper<QList<QString>>
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58);
      QList<QString>::~QList((QList<QString> *)0x291d21);
    }
    else {
      local_38 = (undefined1  [16])
                 emplace_helper<QList<QString>const&>
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58);
    }
  }
  else {
    QHash<QString,_QList<QString>_>::QHash
              ((QHash<QString,_QList<QString>_> *)in_stack_ffffffffffffff50,
               (QHash<QString,_QList<QString>_> *)in_stack_ffffffffffffff48);
    QHash<QString,_QList<QString>_>::detach
              ((QHash<QString,_QList<QString>_> *)in_stack_ffffffffffffff50);
    local_38 = (undefined1  [16])
               emplace_helper<QList<QString>const&>
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
    QHash<QString,_QList<QString>_>::~QHash
              ((QHash<QString,_QList<QString>_> *)in_stack_ffffffffffffff50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)local_38._0_8_;
    iVar3.i.bucket = local_38._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }